

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O0

void writeQuotedString(ostream *os,string *str,bool forceQuotes)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  ostream *poVar6;
  string local_1d8 [39];
  char local_1b1;
  int local_1b0;
  ostringstream local_1a0 [8];
  ostringstream oss;
  int local_24;
  char ch;
  int i;
  int len;
  bool forceQuotes_local;
  string *str_local;
  ostream *os_local;
  
  i._3_1_ = forceQuotes;
  if ((!forceQuotes) && (bVar2 = stringNeedsQuoting(str), bVar2)) {
    i._3_1_ = 1;
  }
  if ((i._3_1_ & 1) != 0) {
    std::operator<<(os,'\"');
  }
  iVar3 = std::__cxx11::string::length();
  for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
    pbVar5 = (byte *)std::__cxx11::string::at((ulong)str);
    bVar1 = *pbVar5;
    if (bVar1 == 7) {
      std::operator<<(os,"\\a");
    }
    else if (bVar1 == 8) {
      std::operator<<(os,"\\b");
    }
    else if (bVar1 == 9) {
      std::operator<<(os,"\\t");
    }
    else if (bVar1 == 10) {
      std::operator<<(os,"\\n");
    }
    else if (bVar1 == 0xb) {
      std::operator<<(os,"\\v");
    }
    else if (bVar1 == 0xc) {
      std::operator<<(os,"\\f");
    }
    else if (bVar1 == 0xd) {
      std::operator<<(os,"\\r");
    }
    else if (bVar1 == 0x5c) {
      std::operator<<(os,"\\\\");
    }
    else {
      iVar4 = isprint((int)(char)bVar1);
      if ((iVar4 == 0) || (bVar1 == 0x22)) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar6 = (ostream *)std::ostream::operator<<(local_1a0,std::oct);
        local_1b0 = (int)std::setw(3);
        poVar6 = std::operator<<(poVar6,(_Setw)local_1b0);
        local_1b1 = (char)std::setfill<char>('0');
        poVar6 = std::operator<<(poVar6,local_1b1);
        std::ostream::operator<<(poVar6,(uint)bVar1);
        poVar6 = std::operator<<(os,"\\");
        std::__cxx11::ostringstream::str();
        std::operator<<(poVar6,local_1d8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      else {
        std::operator<<(os,bVar1);
      }
    }
  }
  if ((i._3_1_ & 1) != 0) {
    std::operator<<(os,'\"');
  }
  return;
}

Assistant:

void writeQuotedString(ostream & os, const string & str, bool forceQuotes) {
   if (!forceQuotes && stringNeedsQuoting(str)) forceQuotes = true;
   if (forceQuotes) os << '"';
   int len = str.length();
   for (int i = 0; i < len; i++) {
      char ch = str.at(i);
      switch (ch) {
       case '\a': os << "\\a"; break;
       case '\b': os << "\\b"; break;
       case '\f': os << "\\f"; break;
       case '\n': os << "\\n"; break;
       case '\r': os << "\\r"; break;
       case '\t': os << "\\t"; break;
       case '\v': os << "\\v"; break;
       case '\\': os << "\\\\"; break;
       default:
         if (isprint(ch) && ch != '"') {
            os << ch;
         } else {
            ostringstream oss;
            oss << oct << setw(3) << setfill('0') << (int(ch) & 0xFF);
            os << "\\" << oss.str();
         }
      }
   }
   if (forceQuotes) os << '"';
}